

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ctor-eval.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_65694::EvallingModuleRunner::EvallingModuleRunner
          (EvallingModuleRunner *this,Module *wasm,ExternalInterface *externalInterface,
          map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
          *linkedInstances_)

{
  map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
  local_58;
  map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
  *local_28;
  map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
  *linkedInstances__local;
  ExternalInterface *externalInterface_local;
  Module *wasm_local;
  EvallingModuleRunner *this_local;
  
  local_28 = linkedInstances_;
  linkedInstances__local =
       (map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
        *)externalInterface;
  externalInterface_local = (ExternalInterface *)wasm;
  wasm_local = (Module *)this;
  std::
  map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
  ::map(&local_58,linkedInstances_);
  ::wasm::ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::ModuleRunnerBase
            (&this->super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>,wasm,
             externalInterface,&local_58);
  std::
  map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
  ::~map(&local_58);
  (this->super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>).
  super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._vptr_ExpressionRunner =
       (_func_int **)&PTR__EvallingModuleRunner_00272bd8;
  return;
}

Assistant:

EvallingModuleRunner(
    Module& wasm,
    ExternalInterface* externalInterface,
    std::map<Name, std::shared_ptr<EvallingModuleRunner>> linkedInstances_ = {})
    : ModuleRunnerBase(wasm, externalInterface, linkedInstances_) {}